

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_alpha_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  unsigned_long_long *puVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  uchar *puVar5;
  undefined8 uVar6;
  uint64 i_2;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  vector<unsigned_long_long> remapped_selectors;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec local_c8;
  
  vector<unsigned_long_long>::vector(&remapped_selectors,(this->m_alpha_selectors).m_size);
  uVar1 = (this->m_alpha_selectors).m_size;
  puVar2 = (this->m_alpha_selectors).m_p;
  puVar3 = remapping->m_p;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    remapped_selectors.m_p[puVar3[uVar7]] = puVar2[uVar7];
  }
  vector<unsigned_int>::vector(&hist.m_hist,0x40);
  uVar7 = 0;
  for (uVar8 = 0; uVar8 < remapped_selectors.m_size; uVar8 = uVar8 + 1) {
    uVar4 = remapped_selectors.m_p[uVar8];
    uVar7 = uVar7 ^ uVar4;
    for (lVar9 = -8; lVar9 != 0; lVar9 = lVar9 + 1) {
      hist.m_hist.m_p[(uint)uVar7 & 0x3f] = hist.m_hist.m_p[(uint)uVar7 & 0x3f] + 1;
      uVar7 = uVar7 >> 6;
    }
    uVar7 = uVar4;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&dm,false,(static_huffman_data_model *)0x0);
  uVar7 = 0;
  for (uVar8 = 0; uVar8 < remapped_selectors.m_size; uVar8 = uVar8 + 1) {
    uVar4 = remapped_selectors.m_p[uVar8];
    uVar7 = uVar7 ^ uVar4;
    for (lVar9 = -8; lVar9 != 0; lVar9 = lVar9 + 1) {
      symbol_codec::encode(&local_c8,(uint)uVar7 & 0x3f,&dm);
      uVar7 = uVar7 >> 6;
    }
    uVar7 = uVar4;
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar5 = packed_data->m_p;
  packed_data->m_p = local_c8.m_output_buf.m_p;
  uVar6._0_4_ = packed_data->m_size;
  uVar6._4_4_ = packed_data->m_capacity;
  packed_data->m_size = local_c8.m_output_buf.m_size;
  packed_data->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar5;
  local_c8.m_output_buf._8_8_ = uVar6;
  symbol_codec::~symbol_codec(&local_c8);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_long_long>::~vector(&remapped_selectors);
  return true;
}

Assistant:

bool crn_comp::pack_alpha_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint64> remapped_selectors(m_alpha_selectors.size());
        for (uint i = 0; i < m_alpha_selectors.size(); i++)
        {
            remapped_selectors[remapping[i]] = m_alpha_selectors[i];
        }
        symbol_histogram hist(64);
        for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
            {
                hist.inc_freq(selector & 0x3F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
            {
                codec.encode(selector & 0x3F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }